

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visualizer.cpp
# Opt level: O1

void __thiscall iDynTree::Visualizer::~Visualizer(Visualizer *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  VisualizerPimpl *pVVar2;
  pointer pcVar3;
  
  this->_vptr_Visualizer = (_func_int **)&PTR__Visualizer_0010c730;
  pVVar2 = this->pimpl;
  if (pVVar2 != (VisualizerPimpl *)0x0) {
    (pVVar2->m_environment).super_IEnvironment._vptr_IEnvironment =
         (_func_int **)&PTR__DummyEnvironment_0010c960;
    (pVVar2->m_environment).m_dummyLight.super_ILight._vptr_ILight =
         (_func_int **)&PTR__DummyLight_0010c9f0;
    pcVar3 = (pVVar2->m_environment).m_dummyLight.dummyName._M_dataplus._M_p;
    paVar1 = &(pVVar2->m_environment).m_dummyLight.dummyName.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
    (pVVar2->m_invalidModelViz).super_IModelVisualization._vptr_IModelVisualization =
         (_func_int **)&PTR__DummyModelVisualization_0010c760;
    iDynTree::Model::~Model(&(pVVar2->m_invalidModelViz).m_dummyModel);
    operator_delete(pVVar2,0x1b8);
  }
  this->pimpl = (VisualizerPimpl *)0x0;
  return;
}

Assistant:

Visualizer::~Visualizer()
{
    close();

    delete pimpl;
    pimpl = 0;
}